

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

xml_node __thiscall
pugi::xml_node::insert_child_after(xml_node *this,xml_node_type type_,xml_node *node)

{
  ulong uVar1;
  xml_allocator *this_00;
  xml_node_struct *pxVar2;
  xml_node_struct *pxVar3;
  xml_node xVar4;
  xml_node_struct *pxVar5;
  uint uVar6;
  xml_node_struct *pxVar7;
  xml_node n;
  xml_node local_28;
  xml_node local_20;
  
  pxVar5 = this->_root;
  if ((pxVar5 == (xml_node_struct *)0x0) || (type_ < node_element)) goto LAB_006f311e;
  uVar6 = (uint)pxVar5->header & 0xf;
  if ((uVar6 - 3 < 0xfffffffe) ||
     (((0xfffffffd < type_ + ~node_doctype && uVar6 != 1 || (node->_root == (xml_node_struct *)0x0))
      || (node->_root->parent != pxVar5)))) goto LAB_006f311e;
  this_00 = *(xml_allocator **)((long)pxVar5 - (pxVar5->header >> 8));
  uVar1 = this_00->_busy_size + 0x40;
  if (uVar1 < 0x7fd9) {
    pxVar5 = (xml_node_struct *)
             ((long)&((xml_node_struct *)this_00->_root)->prev_sibling_c + this_00->_busy_size);
    this_00->_busy_size = uVar1;
    xVar4._root = (xml_node_struct *)this_00->_root;
LAB_006f3162:
    pxVar5->prev_sibling_c = (xml_node_struct *)0x0;
    pxVar5->next_sibling = (xml_node_struct *)0x0;
    pxVar5->parent = (xml_node_struct *)0x0;
    pxVar5->first_child = (xml_node_struct *)0x0;
    pxVar5->name = (char_t *)0x0;
    pxVar5->value = (char_t *)0x0;
    pxVar5->first_attribute = (xml_attribute_struct *)0x0;
    pxVar5->header = (ulong)type_ | ((long)pxVar5 - (long)xVar4._root) * 0x100;
  }
  else {
    pxVar5 = (xml_node_struct *)
             impl::anon_unknown_0::xml_allocator::allocate_memory_oob
                       (this_00,0x40,(xml_memory_page **)&local_20);
    xVar4._root = local_20._root;
    if (pxVar5 != (xml_node_struct *)0x0) goto LAB_006f3162;
    pxVar5 = (xml_node_struct *)0x0;
  }
  xml_node(&local_20,pxVar5);
  if (local_20._root != (xml_node_struct *)0x0) {
    pxVar5 = node->_root;
    pxVar2 = pxVar5->parent;
    (local_20._root)->parent = pxVar2;
    pxVar3 = pxVar5->next_sibling;
    pxVar7 = pxVar3;
    if (pxVar3 == (xml_node_struct *)0x0) {
      pxVar7 = pxVar2->first_child;
    }
    pxVar7->prev_sibling_c = local_20._root;
    (local_20._root)->next_sibling = pxVar3;
    (local_20._root)->prev_sibling_c = pxVar5;
    pxVar5->next_sibling = local_20._root;
    if (type_ != node_declaration) {
      return (xml_node)local_20._root;
    }
    set_name(&local_20,"xml");
    return (xml_node)local_20._root;
  }
LAB_006f311e:
  xml_node(&local_28);
  return (xml_node)local_28._root;
}

Assistant:

PUGI_IMPL_FN xml_node_type xml_node::type() const
	{
		return _root ? PUGI_IMPL_NODETYPE(_root) : node_null;
	}